

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

DdNode * cuddCacheLookup1(DdManager *table,DD_CTFP1 op,DdNode *f)

{
  DdCache *pDVar1;
  DdNode *n;
  DdNode *data;
  DdCache *cache;
  DdCache *en;
  int posn;
  DdNode *f_local;
  DD_CTFP1 op_local;
  DdManager *table_local;
  
  pDVar1 = table->cache +
           (int)(((((uint)(*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f & 1) +
                  (int)op) * 0xc00005 +
                 ((uint)(*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f & 1)) *
                 0x40f1f9 >> ((byte)table->cacheShift & 0x1f));
  if (((pDVar1->data == (DdNode *)0x0) || (pDVar1->f != f)) || ((DD_CTFP1)pDVar1->h != op)) {
    table->cacheMisses = table->cacheMisses + 1.0;
    if ((-1 < table->cacheSlack) && (table->cacheMisses * table->minHit < table->cacheHits)) {
      cuddCacheResize(table);
    }
    table_local = (DdManager *)0x0;
  }
  else {
    n = (DdNode *)((ulong)pDVar1->data & 0xfffffffffffffffe);
    table->cacheHits = table->cacheHits + 1.0;
    if (n->ref == 0) {
      cuddReclaim(table,n);
    }
    table_local = (DdManager *)pDVar1->data;
  }
  return &table_local->sentinel;
}

Assistant:

DdNode *
cuddCacheLookup1(
  DdManager * table,
  DD_CTFP1 op,
  DdNode * f)
{
    int posn;
    DdCache *en,*cache;
    DdNode *data;

    cache = table->cache;
#ifdef DD_DEBUG
    if (cache == NULL) {
        return(NULL);
    }
#endif

    posn = ddCHash2(op,cuddF2L(f),cuddF2L(f),table->cacheShift);
    en = &cache[posn];
    if (en->data != NULL && en->f==f && en->h==(ptruint)op) {
        data = Cudd_Regular(en->data);
        table->cacheHits++;
        if (data->ref == 0) {
            cuddReclaim(table,data);
        }
        return(en->data);
    }

    /* Cache miss: decide whether to resize. */
    table->cacheMisses++;

    if (table->cacheSlack >= 0 &&
        table->cacheHits > table->cacheMisses * table->minHit) {
        cuddCacheResize(table);
    }

    return(NULL);

}